

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,unsigned_long value)

{
  ostream *poVar1;
  long local_198;
  ostringstream oss;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  if ((Catch *)0xfe < this) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," (0x",4);
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( unsigned long value ) {
    std::ostringstream oss;
    oss << value;
    if( value >= 255 )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}